

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void __thiscall Buffer::Buffer(Buffer *this,string *path,EndianessMode _endianess)

{
  size_t sVar1;
  void *pvVar2;
  long *plVar3;
  ExceptionFreeserf *pEVar4;
  size_type *psVar5;
  ifstream file;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [4];
  int aiStack_208 [122];
  
  (this->super_enable_shared_from_this<Buffer>)._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Buffer>)._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Buffer = (_func_int **)&PTR__MutableBuffer_00157b40;
  this->owned = true;
  (this->parent).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->parent).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->endianess = _endianess;
  std::ifstream::ifstream(local_228,(path->_M_dataplus)._M_p,_S_bin|_S_ate);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) != 0) {
    pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::operator+(&local_248,"Failed to open file \'",path);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268._M_dataplus._M_p = (pointer)*plVar3;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_268._M_dataplus._M_p == psVar5) {
      local_268.field_2._M_allocated_capacity = *psVar5;
      local_268.field_2._8_8_ = plVar3[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar5;
    }
    local_268._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_268);
    __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  sVar1 = std::istream::tellg();
  this->size = sVar1;
  std::istream::seekg((long)local_228,_S_beg);
  pvVar2 = malloc(this->size);
  this->data = pvVar2;
  if (pvVar2 != (void *)0x0) {
    std::istream::read((char *)local_228,(long)pvVar2);
    std::ifstream::close();
    this->read = (uint8_t *)this->data;
    std::ifstream::~ifstream(local_228);
    return;
  }
  pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Failed to allocate memory","");
  ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_268);
  __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Buffer::Buffer(const std::string &path, EndianessMode _endianess)
  : owned(true)
  , endianess(_endianess) {
  std::ifstream file(path.c_str(), std::ios::binary | std::ios::ate);
  if (!file.good()) {
    throw ExceptionFreeserf("Failed to open file '" + path + "'");
  }

  size = size_t(file.tellg());

  file.seekg(0, file.beg);

  data = ::malloc(size);
  if (data == nullptr) {
    throw ExceptionFreeserf("Failed to allocate memory");
  }

  file.read(reinterpret_cast<char*>(data), size);
  file.close();

  read = reinterpret_cast<uint8_t*>(data);
}